

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_buffer_send
                   (Curl_send_buffer **inp,connectdata *conn,curl_off_t *bytes_written,
                   size_t included_body_bytes,int socketindex)

{
  curl_socket_t sockfd;
  Curl_easy *data;
  void *pvVar1;
  Curl_send_buffer *pCVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  CURLcode CVar6;
  char *pcVar7;
  Curl_send_buffer *in;
  size_t sVar8;
  ulong uVar9;
  ulong size;
  size_t size_00;
  long size_01;
  ssize_t amount;
  ulong local_48;
  void *local_40;
  long *local_38;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  pCVar2 = *inp;
  sockfd = conn->sock[socketindex];
  pcVar7 = pCVar2->buffer;
  uVar3 = pCVar2->size_used;
  sVar8 = uVar3;
  local_38 = bytes_written;
  if ((((conn->handler->flags & 1) != 0) || ((conn->http_proxy).proxytype == CURLPROXY_HTTPS)) &&
     (conn->httpversion != 0x14)) {
    CVar6 = Curl_get_upload_buffer(data);
    if (CVar6 != CURLE_OK) {
      pcVar7 = pCVar2->buffer;
      goto LAB_00481a6f;
    }
    sVar8 = 0x4000;
    if (uVar3 < 0x4000) {
      sVar8 = uVar3;
    }
    memcpy((data->state).ulbuf,pcVar7,sVar8);
    pcVar7 = (data->state).ulbuf;
  }
  CVar6 = Curl_write(conn,sockfd,pcVar7,sVar8,(ssize_t *)&local_48);
  uVar5 = local_48;
  if (CVar6 == CURLE_OK) {
    uVar9 = uVar3 - included_body_bytes;
    size = uVar9;
    if (local_48 < uVar9) {
      size = local_48;
    }
    size_00 = local_48 - size;
    local_40 = pvVar1;
    if ((((data->set).field_0x87b & 0x40) != 0) &&
       (Curl_debug(data,CURLINFO_HEADER_OUT,pcVar7,size), uVar9 < uVar5)) {
      Curl_debug(data,CURLINFO_DATA_OUT,pcVar7 + size,size_00);
    }
    pvVar1 = local_40;
    *local_38 = *local_38 + local_48;
    if (local_40 == (void *)0x0) {
      if (local_48 != uVar3) {
        return CURLE_SEND_ERROR;
      }
    }
    else {
      size_01 = size_00 + (data->req).writebytecount;
      (data->req).writebytecount = size_01;
      Curl_pgrsSetUploadCounter(data,size_01);
      if (uVar3 - local_48 != 0) {
        pcVar7 = pCVar2->buffer;
        pvVar4 = (data->state).in;
        *(curl_read_callback *)((long)pvVar1 + 0x1e8) = (data->state).fread_func;
        *(void **)((long)pvVar1 + 0x1f0) = pvVar4;
        *(undefined8 *)((long)pvVar1 + 0x1f8) = *(undefined8 *)((long)pvVar1 + 0x10);
        *(undefined8 *)((long)pvVar1 + 0x200) = *(undefined8 *)((long)pvVar1 + 8);
        (data->state).fread_func = readmoredata;
        (data->state).in = conn;
        *(char **)((long)pvVar1 + 0x10) = pcVar7 + local_48;
        *(ulong *)((long)pvVar1 + 8) = uVar3 - local_48;
        *(Curl_send_buffer **)((long)pvVar1 + 0x210) = pCVar2;
        *(undefined4 *)((long)pvVar1 + 0x208) = 1;
        return CURLE_OK;
      }
      *(undefined4 *)((long)pvVar1 + 0x208) = 2;
    }
  }
  pcVar7 = pCVar2->buffer;
LAB_00481a6f:
  (*Curl_cfree)(pcVar7);
  (*Curl_cfree)(pCVar2);
  return CVar6;
}

Assistant:

CURLcode Curl_add_buffer_send(Curl_send_buffer **inp,
                              struct connectdata *conn,

                              /* add the number of sent bytes to this
                                 counter */
                              curl_off_t *bytes_written,

                              /* how much of the buffer contains body data */
                              size_t included_body_bytes,
                              int socketindex)
{
  ssize_t amount;
  CURLcode result;
  char *ptr;
  size_t size;
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;
  size_t sendsize;
  curl_socket_t sockfd;
  size_t headersize;
  Curl_send_buffer *in = *inp;

  DEBUGASSERT(socketindex <= SECONDARYSOCKET);

  sockfd = conn->sock[socketindex];

  /* The looping below is required since we use non-blocking sockets, but due
     to the circumstances we will just loop and try again and again etc */

  ptr = in->buffer;
  size = in->size_used;

  headersize = size - included_body_bytes; /* the initial part that isn't body
                                              is header */

  DEBUGASSERT(size > included_body_bytes);

  result = Curl_convert_to_network(data, ptr, headersize);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result) {
    /* conversion failed, free memory and return to the caller */
    Curl_add_buffer_free(inp);
    return result;
  }

  if((conn->handler->flags & PROTOPT_SSL ||
     conn->http_proxy.proxytype == CURLPROXY_HTTPS)
     && conn->httpversion != 20) {
    /* We never send more than CURL_MAX_WRITE_SIZE bytes in one single chunk
       when we speak HTTPS, as if only a fraction of it is sent now, this data
       needs to fit into the normal read-callback buffer later on and that
       buffer is using this size.
    */

    sendsize = CURLMIN(size, CURL_MAX_WRITE_SIZE);

    /* OpenSSL is very picky and we must send the SAME buffer pointer to the
       library when we attempt to re-send this buffer. Sending the same data
       is not enough, we must use the exact same address. For this reason, we
       must copy the data to the uploadbuffer first, since that is the buffer
       we will be using if this send is retried later.
    */
    result = Curl_get_upload_buffer(data);
    if(result) {
      /* malloc failed, free memory and return to the caller */
      Curl_add_buffer_free(&in);
      return result;
    }
    memcpy(data->state.ulbuf, ptr, sendsize);
    ptr = data->state.ulbuf;
  }
  else
    sendsize = size;

  result = Curl_write(conn, sockfd, ptr, sendsize, &amount);

  if(!result) {
    /*
     * Note that we may not send the entire chunk at once, and we have a set
     * number of data bytes at the end of the big buffer (out of which we may
     * only send away a part).
     */
    /* how much of the header that was sent */
    size_t headlen = (size_t)amount>headersize ? headersize : (size_t)amount;
    size_t bodylen = amount - headlen;

    if(data->set.verbose) {
      /* this data _may_ contain binary stuff */
      Curl_debug(data, CURLINFO_HEADER_OUT, ptr, headlen);
      if(bodylen) {
        /* there was body data sent beyond the initial header part, pass that
           on to the debug callback too */
        Curl_debug(data, CURLINFO_DATA_OUT,
                   ptr + headlen, bodylen);
      }
    }

    /* 'amount' can never be a very large value here so typecasting it so a
       signed 31 bit value should not cause problems even if ssize_t is
       64bit */
    *bytes_written += (long)amount;

    if(http) {
      /* if we sent a piece of the body here, up the byte counter for it
         accordingly */
      data->req.writebytecount += bodylen;
      Curl_pgrsSetUploadCounter(data, data->req.writebytecount);

      if((size_t)amount != size) {
        /* The whole request could not be sent in one system call. We must
           queue it up and send it later when we get the chance. We must not
           loop here and wait until it might work again. */

        size -= amount;

        ptr = in->buffer + amount;

        /* backup the currently set pointers */
        http->backup.fread_func = data->state.fread_func;
        http->backup.fread_in = data->state.in;
        http->backup.postdata = http->postdata;
        http->backup.postsize = http->postsize;

        /* set the new pointers for the request-sending */
        data->state.fread_func = (curl_read_callback)readmoredata;
        data->state.in = (void *)conn;
        http->postdata = ptr;
        http->postsize = (curl_off_t)size;

        http->send_buffer = in;
        http->sending = HTTPSEND_REQUEST;

        return CURLE_OK;
      }
      http->sending = HTTPSEND_BODY;
      /* the full buffer was sent, clean up and return */
    }
    else {
      if((size_t)amount != size)
        /* We have no continue-send mechanism now, fail. This can only happen
           when this function is used from the CONNECT sending function. We
           currently (stupidly) assume that the whole request is always sent
           away in the first single chunk.

           This needs FIXing.
        */
        return CURLE_SEND_ERROR;
    }
  }
  Curl_add_buffer_free(&in);

  return result;
}